

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O1

bool google::GetSectionHeaderByType
               (int fd,Elf64_Half sh_num,off_t sh_offset,Elf64_Word type,Elf64_Shdr *out)

{
  Elf64_Word *pEVar1;
  undefined8 uVar2;
  Elf64_Xword EVar3;
  Elf64_Addr EVar4;
  Elf64_Off EVar5;
  Elf64_Xword EVar6;
  undefined8 uVar7;
  Elf64_Xword EVar8;
  byte in_AL;
  int iVar9;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  size_t count;
  undefined8 *puVar14;
  undefined6 in_register_00000032;
  undefined8 *puVar15;
  bool bVar16;
  Elf64_Shdr buf [16];
  byte local_43c;
  undefined8 local_438;
  int iVar10;
  
  iVar12 = 0;
  do {
    iVar10 = (int)CONCAT62(in_register_00000032,sh_num);
    iVar9 = iVar10 - iVar12;
    if (iVar9 == 0 || iVar10 < iVar12) {
      local_43c = 0;
      break;
    }
    count = (long)iVar9 << 6;
    if (0x3ff < count) {
      count = 0x400;
    }
    uVar11 = ReadFromOffset(fd,&local_438,count,(long)iVar12 * 0x40 + sh_offset);
    if (uVar11 == 0xffffffffffffffff) {
      bVar16 = false;
      local_43c = 0;
    }
    else {
      if (((uVar11 & 0x3f) != 0) || (0x43f < uVar11)) {
        abort();
      }
      uVar13 = uVar11 >> 6;
      bVar16 = uVar11 == 0;
      local_43c = in_AL;
      if (!bVar16) {
        puVar14 = &local_438;
        if (local_438._4_4_ != type) {
          uVar11 = 0;
          puVar15 = &local_438;
          do {
            if (uVar13 - 1 == uVar11) {
              bVar16 = true;
              goto LAB_001183f6;
            }
            puVar14 = puVar15 + 8;
            uVar11 = uVar11 + 1;
            pEVar1 = (Elf64_Word *)((long)puVar15 + 0x44);
            puVar15 = puVar14;
          } while (*pEVar1 != type);
          bVar16 = uVar13 <= uVar11;
        }
        uVar2 = *puVar14;
        EVar3 = puVar14[1];
        EVar4 = puVar14[2];
        EVar5 = puVar14[3];
        EVar6 = puVar14[4];
        uVar7 = puVar14[5];
        EVar8 = puVar14[7];
        out->sh_addralign = puVar14[6];
        out->sh_entsize = EVar8;
        out->sh_size = EVar6;
        out->sh_link = (int)uVar7;
        out->sh_info = (int)((ulong)uVar7 >> 0x20);
        out->sh_addr = EVar4;
        out->sh_offset = EVar5;
        out->sh_name = (int)uVar2;
        out->sh_type = (int)((ulong)uVar2 >> 0x20);
        out->sh_flags = EVar3;
        local_43c = 1;
      }
LAB_001183f6:
      iVar9 = (int)uVar13;
      if (!bVar16) {
        iVar9 = 0;
      }
      iVar12 = iVar9 + iVar12;
    }
    in_AL = local_43c;
  } while (bVar16);
  return (bool)(local_43c & 1);
}

Assistant:

static ATTRIBUTE_NOINLINE bool
GetSectionHeaderByType(const int fd, ElfW(Half) sh_num, const off_t sh_offset,
                       ElfW(Word) type, ElfW(Shdr) *out) {
  // Read at most 16 section headers at a time to save read calls.
  ElfW(Shdr) buf[16];
  for (int i = 0; i < sh_num;) {
    const ssize_t num_bytes_left = (sh_num - i) * sizeof(buf[0]);
    const ssize_t num_bytes_to_read =
        (sizeof(buf) > num_bytes_left) ? num_bytes_left : sizeof(buf);
    const ssize_t len = ReadFromOffset(fd, buf, num_bytes_to_read,
                                       sh_offset + i * sizeof(buf[0]));
    if (len == -1) {
      return false;
    }
    SAFE_ASSERT(len % sizeof(buf[0]) == 0);
    const ssize_t num_headers_in_buf = len / sizeof(buf[0]);
    SAFE_ASSERT(num_headers_in_buf <= sizeof(buf) / sizeof(buf[0]));
    for (int j = 0; j < num_headers_in_buf; ++j) {
      if (buf[j].sh_type == type) {
        *out = buf[j];
        return true;
      }
    }
    i += num_headers_in_buf;
  }
  return false;
}